

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow.cpp
# Opt level: O1

bool CheckProofOfWorkImpl(uint256 hash,uint nBits,Params *params)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  arith_uint256 bnTarget;
  bool local_5a;
  bool local_59;
  base_uint<256U> local_58;
  base_uint<256U> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.pn[4] = 0;
  local_38.pn[5] = 0;
  local_38.pn[6] = 0;
  local_38.pn[7] = 0;
  local_38.pn[0] = 0;
  local_38.pn[1] = 0;
  local_38.pn[2] = 0;
  local_38.pn[3] = 0;
  arith_uint256::SetCompact((arith_uint256 *)&local_38,nBits,&local_59,&local_5a);
  if (local_59 == false) {
    bVar1 = base_uint<256U>::EqualTo(&local_38,0);
    if ((!bVar1) && (local_5a == false)) {
      UintToArith256((arith_uint256 *)&local_58,&params->powLimit);
      iVar2 = base_uint<256U>::CompareTo(&local_38,&local_58);
      if (iVar2 < 1) {
        UintToArith256((arith_uint256 *)&local_58,&hash);
        iVar2 = base_uint<256U>::CompareTo(&local_58,&local_38);
        bVar1 = iVar2 < 1;
        goto LAB_00288721;
      }
    }
  }
  bVar1 = false;
LAB_00288721:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckProofOfWorkImpl(uint256 hash, unsigned int nBits, const Consensus::Params& params)
{
    bool fNegative;
    bool fOverflow;
    arith_uint256 bnTarget;

    bnTarget.SetCompact(nBits, &fNegative, &fOverflow);

    // Check range
    if (fNegative || bnTarget == 0 || fOverflow || bnTarget > UintToArith256(params.powLimit))
        return false;

    // Check proof of work matches claimed amount
    if (UintToArith256(hash) > bnTarget)
        return false;

    return true;
}